

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Value * google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MILSpec::Value>
                  (Arena *arena)

{
  Value *pVVar1;
  
  if (arena != (Arena *)0x0) {
    pVVar1 = DoCreateMessage<CoreML::Specification::MILSpec::Value>(arena);
    return pVVar1;
  }
  pVVar1 = (Value *)operator_new(0x30);
  CoreML::Specification::MILSpec::Value::Value(pVVar1,(Arena *)0x0,false);
  return pVVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }